

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_scriptutil.cpp
# Opt level: O0

void __thiscall
ScriptUtil_GetP2wpkhLockingScriptTest_Test::TestBody
          (ScriptUtil_GetP2wpkhLockingScriptTest_Test *this)

{
  allocator<ScriptUtil_PubkeyTestVector> *this_00;
  initializer_list<ScriptUtil_PubkeyTestVector> __l;
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  ScriptUtil_PubkeyTestVector *local_478;
  AssertHelper local_3f8;
  Message local_3f0;
  string local_3e8;
  string local_3c8;
  undefined1 local_3a8 [8];
  AssertionResult gtest_ar_1;
  Message local_390;
  Script local_388;
  undefined1 local_350 [8];
  ByteData160 pubkey_hash;
  Message local_330;
  string local_328;
  string local_308;
  undefined1 local_2e8 [8];
  AssertionResult gtest_ar;
  Message local_2d0 [2];
  Script local_2c0;
  reference local_288;
  ScriptUtil_PubkeyTestVector *test_vector;
  const_iterator __end1;
  const_iterator __begin1;
  vector<ScriptUtil_PubkeyTestVector,_std::allocator<ScriptUtil_PubkeyTestVector>_> *__range1;
  Script actual;
  string local_228;
  allocator local_201;
  string local_200;
  undefined1 local_1da;
  allocator local_1d9;
  string local_1d8;
  allocator local_1b1;
  string local_1b0;
  undefined1 local_18a;
  allocator local_189;
  string local_188;
  allocator local_151;
  string local_150;
  ScriptUtil_PubkeyTestVector *local_130;
  ScriptUtil_PubkeyTestVector local_128;
  Pubkey local_d8;
  Script SStack_c0;
  Pubkey local_88;
  Script SStack_70;
  undefined1 local_38 [24];
  vector<ScriptUtil_PubkeyTestVector,_std::allocator<ScriptUtil_PubkeyTestVector>_> test_vectors;
  ScriptUtil_GetP2wpkhLockingScriptTest_Test *this_local;
  
  actual.script_stack_.
  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._5_1_ = 1;
  local_130 = &local_128;
  test_vectors.
  super__Vector_base<ScriptUtil_PubkeyTestVector,_std::allocator<ScriptUtil_PubkeyTestVector>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_150,
             "02522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a0",&local_151);
  cfd::core::Pubkey::Pubkey(&local_128.input_pubkey,&local_150);
  local_18a = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_188,"0014edaf2414751239b72b653ea004adc310a3522e37",&local_189);
  cfd::core::Script::Script(&local_128.expect_locking_script,&local_188);
  local_18a = 0;
  local_130 = (ScriptUtil_PubkeyTestVector *)&local_d8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1b0,
             "0340b52ae45bc1be5de083f1730fe537374e219c4836400623741d2a874e60590c",&local_1b1);
  cfd::core::Pubkey::Pubkey(&local_d8,&local_1b0);
  local_1da = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1d8,"001449a011f97ba520dab063f309bad59daeb30de101",&local_1d9);
  cfd::core::Script::Script(&SStack_c0,&local_1d8);
  local_1da = 0;
  local_130 = (ScriptUtil_PubkeyTestVector *)&local_88;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_200,
             "04fe53c78e36b86aae8082484a4007b706d5678cabb92d178fc95020d4d8dc41ef44cfbb8dfa7a593c7910a5b6f94d079061a7766cbeed73e24ee4f654f1e51904"
             ,&local_201);
  cfd::core::Pubkey::Pubkey(&local_88,&local_200);
  actual.script_stack_.
  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_228,"00148c1c7f335f5db8ae4e01615edb14844213ead725",
             (allocator *)
             ((long)&actual.script_stack_.
                     super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::Script::Script(&SStack_70,&local_228);
  actual.script_stack_.
  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
  actual.script_stack_.
  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._5_1_ = 0;
  local_38._0_8_ = &local_128;
  local_38._8_8_ = (pointer)0x3;
  this_00 = (allocator<ScriptUtil_PubkeyTestVector> *)
            ((long)&actual.script_stack_.
                    super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 4);
  std::allocator<ScriptUtil_PubkeyTestVector>::allocator(this_00);
  __l._M_len = local_38._8_8_;
  __l._M_array = (iterator)local_38._0_8_;
  std::vector<ScriptUtil_PubkeyTestVector,_std::allocator<ScriptUtil_PubkeyTestVector>_>::vector
            ((vector<ScriptUtil_PubkeyTestVector,_std::allocator<ScriptUtil_PubkeyTestVector>_> *)
             (local_38 + 0x10),__l,this_00);
  std::allocator<ScriptUtil_PubkeyTestVector>::~allocator
            ((allocator<ScriptUtil_PubkeyTestVector> *)
             ((long)&actual.script_stack_.
                     super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  local_478 = (ScriptUtil_PubkeyTestVector *)local_38;
  do {
    local_478 = local_478 + -1;
    ScriptUtil_PubkeyTestVector::~ScriptUtil_PubkeyTestVector(local_478);
  } while (local_478 != &local_128);
  std::__cxx11::string::~string((string *)&local_228);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&actual.script_stack_.
                     super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::__cxx11::string::~string((string *)&local_200);
  std::allocator<char>::~allocator((allocator<char> *)&local_201);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
  std::__cxx11::string::~string((string *)&local_188);
  std::allocator<char>::~allocator((allocator<char> *)&local_189);
  std::__cxx11::string::~string((string *)&local_150);
  std::allocator<char>::~allocator((allocator<char> *)&local_151);
  cfd::core::Script::Script((Script *)&__range1);
  __end1 = std::vector<ScriptUtil_PubkeyTestVector,_std::allocator<ScriptUtil_PubkeyTestVector>_>::
           begin((vector<ScriptUtil_PubkeyTestVector,_std::allocator<ScriptUtil_PubkeyTestVector>_>
                  *)(local_38 + 0x10));
  test_vector = (ScriptUtil_PubkeyTestVector *)
                std::
                vector<ScriptUtil_PubkeyTestVector,_std::allocator<ScriptUtil_PubkeyTestVector>_>::
                end((vector<ScriptUtil_PubkeyTestVector,_std::allocator<ScriptUtil_PubkeyTestVector>_>
                     *)(local_38 + 0x10));
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_ScriptUtil_PubkeyTestVector_*,_std::vector<ScriptUtil_PubkeyTestVector,_std::allocator<ScriptUtil_PubkeyTestVector>_>_>
                                     *)&test_vector), bVar1) {
    local_288 = __gnu_cxx::
                __normal_iterator<const_ScriptUtil_PubkeyTestVector_*,_std::vector<ScriptUtil_PubkeyTestVector,_std::allocator<ScriptUtil_PubkeyTestVector>_>_>
                ::operator*(&__end1);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      bVar1 = testing::internal::AlwaysTrue();
      if (bVar1) {
        cfd::core::ScriptUtil::CreateP2wpkhLockingScript(&local_2c0,&local_288->input_pubkey);
        cfd::core::Script::operator=((Script *)&__range1,&local_2c0);
        cfd::core::Script::~Script(&local_2c0);
      }
    }
    else {
      testing::Message::Message(local_2d0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_scriptutil.cpp"
                 ,0x5f,
                 "Expected: (actual = ScriptUtil::CreateP2wpkhLockingScript(test_vector.input_pubkey)) doesn\'t throw an exception.\n  Actual: it throws."
                );
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar.message_,local_2d0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
      testing::Message::~Message(local_2d0);
    }
    cfd::core::Script::GetHex_abi_cxx11_(&local_308,(Script *)&__range1);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    cfd::core::Script::GetHex_abi_cxx11_(&local_328,&local_288->expect_locking_script);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::CmpHelperSTREQ
              ((internal *)local_2e8,"actual.GetHex().c_str()",
               "test_vector.expect_locking_script.GetHex().c_str()",pcVar2,pcVar3);
    std::__cxx11::string::~string((string *)&local_328);
    std::__cxx11::string::~string((string *)&local_308);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2e8);
    if (!bVar1) {
      testing::Message::Message(&local_330);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2e8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)
                 &pubkey_hash.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_scriptutil.cpp"
                 ,0x60,pcVar2);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)
                 &pubkey_hash.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,&local_330);
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)
                 &pubkey_hash.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      testing::Message::~Message(&local_330);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_2e8);
    cfd::core::HashUtil::Hash160((ByteData160 *)local_350,&local_288->input_pubkey);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      bVar1 = testing::internal::AlwaysTrue();
      if (bVar1) {
        cfd::core::ScriptUtil::CreateP2wpkhLockingScript(&local_388,(ByteData160 *)local_350);
        cfd::core::Script::operator=((Script *)&__range1,&local_388);
        cfd::core::Script::~Script(&local_388);
      }
    }
    else {
      testing::Message::Message(&local_390);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_scriptutil.cpp"
                 ,0x62,
                 "Expected: (actual = ScriptUtil::CreateP2wpkhLockingScript(pubkey_hash)) doesn\'t throw an exception.\n  Actual: it throws."
                );
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_390);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
      testing::Message::~Message(&local_390);
    }
    cfd::core::Script::GetHex_abi_cxx11_(&local_3c8,(Script *)&__range1);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    cfd::core::Script::GetHex_abi_cxx11_(&local_3e8,&local_288->expect_locking_script);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::CmpHelperSTREQ
              ((internal *)local_3a8,"actual.GetHex().c_str()",
               "test_vector.expect_locking_script.GetHex().c_str()",pcVar2,pcVar3);
    std::__cxx11::string::~string((string *)&local_3e8);
    std::__cxx11::string::~string((string *)&local_3c8);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3a8);
    if (!bVar1) {
      testing::Message::Message(&local_3f0);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3a8);
      testing::internal::AssertHelper::AssertHelper
                (&local_3f8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_scriptutil.cpp"
                 ,99,pcVar2);
      testing::internal::AssertHelper::operator=(&local_3f8,&local_3f0);
      testing::internal::AssertHelper::~AssertHelper(&local_3f8);
      testing::Message::~Message(&local_3f0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_3a8);
    cfd::core::ByteData160::~ByteData160((ByteData160 *)local_350);
    __gnu_cxx::
    __normal_iterator<const_ScriptUtil_PubkeyTestVector_*,_std::vector<ScriptUtil_PubkeyTestVector,_std::allocator<ScriptUtil_PubkeyTestVector>_>_>
    ::operator++(&__end1);
  }
  cfd::core::Script::~Script((Script *)&__range1);
  std::vector<ScriptUtil_PubkeyTestVector,_std::allocator<ScriptUtil_PubkeyTestVector>_>::~vector
            ((vector<ScriptUtil_PubkeyTestVector,_std::allocator<ScriptUtil_PubkeyTestVector>_> *)
             (local_38 + 0x10));
  return;
}

Assistant:

TEST(ScriptUtil, GetP2wpkhLockingScriptTest) {
  const std::vector<ScriptUtil_PubkeyTestVector> test_vectors = {
    {
      Pubkey("02522952c3fc2a53a8651b08ce10988b7506a3b40a5c26f9648a911be33e73e1a0"),
      Script("0014edaf2414751239b72b653ea004adc310a3522e37")
    },
    {
      Pubkey("0340b52ae45bc1be5de083f1730fe537374e219c4836400623741d2a874e60590c"),
      Script("001449a011f97ba520dab063f309bad59daeb30de101")
    },
    {
      Pubkey("04fe53c78e36b86aae8082484a4007b706d5678cabb92d178fc95020d4d8dc41ef44cfbb8dfa7a593c7910a5b6f94d079061a7766cbeed73e24ee4f654f1e51904"),
      Script("00148c1c7f335f5db8ae4e01615edb14844213ead725")
    },
  };

  Script actual;
  for (const ScriptUtil_PubkeyTestVector& test_vector : test_vectors) {
    EXPECT_NO_THROW((actual = ScriptUtil::CreateP2wpkhLockingScript(test_vector.input_pubkey)));
    EXPECT_STREQ(actual.GetHex().c_str(), test_vector.expect_locking_script.GetHex().c_str());
    ByteData160 pubkey_hash = HashUtil::Hash160(test_vector.input_pubkey);
    EXPECT_NO_THROW((actual = ScriptUtil::CreateP2wpkhLockingScript(pubkey_hash)));
    EXPECT_STREQ(actual.GetHex().c_str(), test_vector.expect_locking_script.GetHex().c_str());
  }
}